

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O2

string * positionDeque2String_abi_cxx11_
                   (string *__return_storage_ptr__,dequePositionTy *_l,positionTy *posAfterLast)

{
  char cVar1;
  _Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*> *__return_storage_ptr___00;
  positionTy *ppVar2;
  _Map_pointer pppVar3;
  positionTy *this;
  positionTy *local_130;
  _Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*> local_120;
  _Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*> local_100;
  vectorTy v;
  _Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*> local_c0;
  dequePositionTy l;
  _Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((_l->super__Deque_base<positionTy,_std::allocator<positionTy>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      (_l->super__Deque_base<positionTy,_std::allocator<positionTy>_>)._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  else {
    std::deque<positionTy,_std::allocator<positionTy>_>::deque(&l,_l);
    local_130 = l.super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
                super__Deque_impl_data._M_start._M_first;
    ppVar2 = l.super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    pppVar3 = l.super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    this = l.super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
    while (this != l.super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur) {
      positionTy::dbgTxt_abi_cxx11_((string *)&v,this);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&v);
      local_100._M_first = local_130;
      local_100._M_cur = this;
      local_100._M_last = ppVar2;
      local_100._M_node = pppVar3;
      std::next<std::_Deque_iterator<positionTy,positionTy_const&,positionTy_const*>>
                ((_Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*> *)&v,
                 &local_100,1);
      cVar1 = (char)__return_storage_ptr__;
      if ((_Elt_pointer)v.angle ==
          l.super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur) {
        if (posAfterLast != (positionTy *)0x0) {
          CoordVectorBetween(&v,this,posAfterLast);
          if (1e-05 < v.dist) {
            std::__cxx11::string::push_back(cVar1);
            __return_storage_ptr___00 = &local_c0;
            vectorTy::operator_cast_to_string((string *)__return_storage_ptr___00,&v);
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            goto LAB_0012177d;
          }
        }
      }
      else {
        std::__cxx11::string::push_back(cVar1);
        local_120._M_first = local_130;
        local_120._M_cur = this;
        local_120._M_last = ppVar2;
        local_120._M_node = pppVar3;
        std::next<std::_Deque_iterator<positionTy,positionTy_const&,positionTy_const*>>
                  (&local_50,&local_120,1);
        CoordVectorBetween((vectorTy *)&local_c0,this,local_50._M_cur);
        vectorTy::operator_cast_to_string((string *)&v,(vectorTy *)&local_c0);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        __return_storage_ptr___00 =
             (_Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*> *)&v;
LAB_0012177d:
        std::__cxx11::string::~string((string *)__return_storage_ptr___00);
      }
      std::__cxx11::string::push_back(cVar1);
      this = this + 1;
      if (this == ppVar2) {
        this = pppVar3[1];
        pppVar3 = pppVar3 + 1;
        ppVar2 = this + 7;
        local_130 = this;
      }
    }
    std::_Deque_base<positionTy,_std::allocator<positionTy>_>::~_Deque_base
              (&l.super__Deque_base<positionTy,_std::allocator<positionTy>_>);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string positionDeque2String (const dequePositionTy& _l,
                                  const positionTy* posAfterLast)
{
    std::string ret;
    
    if (_l.empty())
        ret = "<empty>\n";
    else {
        // copy for better thread safety
        const dequePositionTy l(_l);
        for (dequePositionTy::const_iterator iter = l.cbegin();
            iter != l.cend();
            ++iter)
        {
            ret += iter->dbgTxt();              // add position info
            if (std::next(iter) != l.cend())    // there is a next position
            {
                ret += ' ';                     // add vector to next position
                ret += iter->between(*std::next(iter));
            } else if (posAfterLast) {          // a pos after last is given for final vector?
                const vectorTy v = iter->between(*posAfterLast);
                if (v.dist > 0.00001) {         // and that pos is not about the same as current
                    ret += ' ';                 // add vector to that position
                    ret += v;
                }
            }
            ret += '\n';
        }
    }
    return ret;
}